

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O0

bitset<32UL>
jsoncons::decode_traits<std::bitset<32ul>,char,void>::
decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
          (basic_staj_cursor<char> *cursor,
          json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          *decoder,error_code *ec)

{
  error_code ec_00;
  error_code ec_01;
  bool bVar1;
  undefined8 uVar2;
  error_category *peVar3;
  ser_error *this;
  size_t column;
  long *plVar4;
  long *plVar5;
  type tVar6;
  error_code *in_RDX;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_RSI;
  long *in_RDI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  conv_errc __e;
  error_code *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  ser_error *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  error_category *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff98;
  
  __e = (conv_errc)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::reset(in_stack_ffffffffffffff40);
  (**(code **)(*in_RDI + 0x30))(in_RDI,in_RSI,in_RDX);
  bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
  if (bVar1) {
    uVar2 = __cxa_allocate_exception(0x58);
    plVar4 = (long *)(**(code **)(*in_RDI + 0x48))();
    peVar3 = (error_category *)(**(code **)(*plVar4 + 0x10))();
    plVar4 = (long *)(**(code **)(*in_RDI + 0x48))();
    this = (ser_error *)(**(code **)(*plVar4 + 0x18))();
    ec_00._M_cat = peVar3;
    ec_00._0_8_ = plVar4;
    ser_error::ser_error(this,ec_00,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
  }
  bVar1 = json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          ::is_valid(in_RSI);
  if (!bVar1) {
    column = __cxa_allocate_exception(0x58);
    std::error_code::error_code<jsoncons::conv_errc,void>(in_stack_ffffffffffffff50,__e);
    plVar4 = (long *)(**(code **)(*in_RDI + 0x48))();
    (**(code **)(*plVar4 + 0x10))();
    plVar5 = (long *)(**(code **)(*in_RDI + 0x48))();
    (**(code **)(*plVar5 + 0x18))();
    ec_01._M_cat = in_stack_ffffffffffffff80;
    ec_01._0_8_ = in_stack_ffffffffffffff78;
    ser_error::ser_error(in_stack_ffffffffffffff70,ec_01,(size_t)plVar4,column);
    __cxa_throw(column,&ser_error::typeinfo,ser_error::~ser_error);
  }
  this_00 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
            &stack0xffffffffffffff98;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::get_result((json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                *)in_stack_ffffffffffffff98);
  tVar6 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::as<std::bitset<32ul>>
                    (this_00);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x2a0d83);
  return (bitset<32UL>)tVar6.super__Base_bitset<1UL>._M_w._M_w;
}

Assistant:

static T decode(basic_staj_cursor<CharT>& cursor, 
            json_decoder<Json,TempAllocator>& decoder, 
            std::error_code& ec)
        {
            decoder.reset();
            cursor.read_to(decoder, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec, cursor.context().line(), cursor.context().column()));
            }
            else if (!decoder.is_valid())
            {
                JSONCONS_THROW(ser_error(conv_errc::conversion_failed, cursor.context().line(), cursor.context().column()));
            }
            return decoder.get_result().template as<T>();
        }